

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigConstr.c
# Opt level: O0

Vec_Ptr_t * Saig_ManDetectConstrCheckCont(Vec_Ptr_t *vSuper,Vec_Ptr_t *vSuper2)

{
  int iVar1;
  void *pvVar2;
  Vec_Ptr_t *p;
  int local_3c;
  int i;
  Aig_Obj_t *pObj2;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vUnique;
  Vec_Ptr_t *vSuper2_local;
  Vec_Ptr_t *vSuper_local;
  
  local_3c = 0;
  while( true ) {
    iVar1 = Vec_PtrSize(vSuper2);
    if (iVar1 <= local_3c) {
      p = Vec_PtrAlloc(100);
      for (local_3c = 0; iVar1 = Vec_PtrSize(vSuper), local_3c < iVar1; local_3c = local_3c + 1) {
        pvVar2 = Vec_PtrEntry(vSuper,local_3c);
        iVar1 = Vec_PtrFind(vSuper2,pvVar2);
        if (iVar1 == -1) {
          Vec_PtrPush(p,pvVar2);
        }
      }
      return p;
    }
    pvVar2 = Vec_PtrEntry(vSuper2,local_3c);
    iVar1 = Vec_PtrFind(vSuper,pvVar2);
    if (iVar1 == -1) break;
    local_3c = local_3c + 1;
  }
  return (Vec_Ptr_t *)0x0;
}

Assistant:

Vec_Ptr_t * Saig_ManDetectConstrCheckCont( Vec_Ptr_t * vSuper, Vec_Ptr_t * vSuper2 )
{
    Vec_Ptr_t * vUnique;
    Aig_Obj_t * pObj, * pObj2;
    int i;
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper2, pObj2, i )
        if ( Vec_PtrFind( vSuper, pObj2 ) == -1 )
            return 0;
    vUnique = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vSuper, pObj, i )
        if ( Vec_PtrFind( vSuper2, pObj ) == -1 )
            Vec_PtrPush( vUnique, pObj );
    return vUnique;
}